

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCutTrav.c
# Opt level: O3

void Ivy_ManTestCutsTravAll(Ivy_Man_t *p)

{
  Ivy_Obj_t *pObj;
  void *__ptr;
  int iVar1;
  Vec_Ptr_t *vNodes;
  void **ppvVar2;
  Vec_Ptr_t *vFront;
  Vec_Int_t *vStore;
  int *piVar3;
  Vec_Vec_t *vBitCuts;
  Vec_Ptr_t *pVVar4;
  uint nNodeLimit;
  int iVar5;
  long lVar6;
  uint uVar7;
  int level;
  Ivy_Man_t *p_00;
  uint uVar8;
  uint uVar9;
  long lVar10;
  timespec ts;
  
  iVar1 = clock_gettime(3,(timespec *)&ts);
  if (iVar1 < 0) {
    lVar6 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
    lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + ts.tv_sec * -1000000;
  }
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  vNodes->nCap = 100;
  vNodes->nSize = 0;
  ppvVar2 = (void **)malloc(800);
  vNodes->pArray = ppvVar2;
  vFront = (Vec_Ptr_t *)malloc(0x10);
  vFront->nCap = 100;
  vFront->nSize = 0;
  ppvVar2 = (void **)malloc(800);
  vFront->pArray = ppvVar2;
  vStore = (Vec_Int_t *)malloc(0x10);
  vStore->nCap = 100;
  vStore->nSize = 0;
  piVar3 = (int *)malloc(400);
  vStore->pArray = piVar3;
  vBitCuts = (Vec_Vec_t *)malloc(0x10);
  vBitCuts->nCap = 100;
  vBitCuts->nSize = 0;
  p_00 = (Ivy_Man_t *)0x320;
  ppvVar2 = (void **)malloc(800);
  vBitCuts->pArray = ppvVar2;
  iVar1 = p->nObjs[5];
  iVar5 = p->nObjs[6];
  uVar8 = -(iVar1 + iVar5);
  pVVar4 = p->vObjs;
  if (pVVar4->nSize < 1) {
    uVar7 = 0;
    uVar9 = 0;
  }
  else {
    lVar10 = 0;
    uVar9 = 0;
    uVar7 = 0;
    do {
      pObj = (Ivy_Obj_t *)pVVar4->pArray[lVar10];
      if ((pObj != (Ivy_Obj_t *)0x0) &&
         (nNodeLimit = (*(uint *)&pObj->field_0x8 & 0xf) - 7, 0xfffffffd < nNodeLimit)) {
        Ivy_NodeFindCutsTravAll(p_00,pObj,4,nNodeLimit,vNodes,vFront,vStore,vBitCuts);
        uVar8 = uVar8 + Ivy_NodeFindCutsTravAll::CutStore.nCuts;
        uVar9 = uVar9 + (Ivy_NodeFindCutsTravAll::CutStore.nCuts == 0x100);
        uVar7 = uVar7 + 1;
        pVVar4 = p->vObjs;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < pVVar4->nSize);
    iVar1 = p->nObjs[5];
    iVar5 = p->nObjs[6];
  }
  level = 0x93faf2;
  printf("Total cuts = %6d. Trivial = %6d.   Nodes = %6d. Satur = %6d.  ",(ulong)uVar8,
         (ulong)(uint)(iVar1 + p->nObjs[1] + iVar5),(ulong)uVar7,(ulong)uVar9);
  Abc_Print(level,"%s =","Time");
  iVar5 = 3;
  iVar1 = clock_gettime(3,(timespec *)&ts);
  if (iVar1 < 0) {
    lVar10 = -1;
  }
  else {
    lVar10 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
  }
  Abc_Print(iVar5,"%9.2f sec\n",(double)(lVar10 + lVar6) / 1000000.0);
  if (vNodes->pArray != (void **)0x0) {
    free(vNodes->pArray);
  }
  free(vNodes);
  if (vFront->pArray != (void **)0x0) {
    free(vFront->pArray);
  }
  free(vFront);
  if (vStore->pArray != (int *)0x0) {
    free(vStore->pArray);
  }
  free(vStore);
  iVar1 = vBitCuts->nSize;
  ppvVar2 = vBitCuts->pArray;
  if ((long)iVar1 < 1) {
    if (ppvVar2 == (void **)0x0) goto LAB_007529eb;
  }
  else {
    lVar6 = 0;
    do {
      __ptr = ppvVar2[lVar6];
      if (__ptr != (void *)0x0) {
        if (*(void **)((long)__ptr + 8) != (void *)0x0) {
          free(*(void **)((long)__ptr + 8));
        }
        free(__ptr);
      }
      lVar6 = lVar6 + 1;
    } while (iVar1 != lVar6);
  }
  free(ppvVar2);
LAB_007529eb:
  free(vBitCuts);
  return;
}

Assistant:

void Ivy_ManTestCutsTravAll( Ivy_Man_t * p )
{
    Ivy_Store_t * pStore;
    Ivy_Obj_t * pObj;
    Vec_Ptr_t * vNodes, * vFront;
    Vec_Int_t * vStore;
    Vec_Vec_t * vBitCuts;
    int i, nCutsCut, nCutsTotal, nNodeTotal, nNodeOver;
    abctime clk = Abc_Clock();

    vNodes = Vec_PtrAlloc( 100 );
    vFront = Vec_PtrAlloc( 100 );
    vStore = Vec_IntAlloc( 100 );
    vBitCuts = Vec_VecAlloc( 100 );

    nNodeTotal = nNodeOver = 0;
    nCutsTotal = -Ivy_ManNodeNum(p);
    Ivy_ManForEachObj( p, pObj, i )
    {
        if ( !Ivy_ObjIsNode(pObj) )
            continue;
        pStore = Ivy_NodeFindCutsTravAll( p, pObj, 4, 60, vNodes, vFront, vStore, vBitCuts );
        nCutsCut    = pStore->nCuts;
        nCutsTotal += nCutsCut;
        nNodeOver  += (nCutsCut == IVY_CUT_LIMIT);
        nNodeTotal++;
    }
    printf( "Total cuts = %6d. Trivial = %6d.   Nodes = %6d. Satur = %6d.  ", 
        nCutsTotal, Ivy_ManPiNum(p) + Ivy_ManNodeNum(p), nNodeTotal, nNodeOver );
    ABC_PRT( "Time", Abc_Clock() - clk );

    Vec_PtrFree( vNodes );
    Vec_PtrFree( vFront );
    Vec_IntFree( vStore );
    Vec_VecFree( vBitCuts );

}